

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::Append(FormatSinkImpl *this,string_view v)

{
  ulong __n;
  
  __n = v._M_len;
  if (__n != 0) {
    this->size_ = this->size_ + __n;
    if ((ulong)((long)this + (0x420 - (long)this->pos_)) <= __n) {
      Flush(this);
      (*(this->raw_).write_)((this->raw_).sink_,v);
      return;
    }
    memcpy(this->pos_,v._M_str,__n);
    this->pos_ = this->pos_ + __n;
  }
  return;
}

Assistant:

void Append(string_view v) {
    size_t n = v.size();
    if (n == 0) return;
    size_ += n;
    if (n >= Avail()) {
      Flush();
      raw_.Write(v);
      return;
    }
    memcpy(pos_, v.data(), n);
    pos_ += n;
  }